

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O2

uchar * mcmalo0(mcmcxdef *cctx,ushort siz,mcmon *nump,mcmon clinum,int noclitrans)

{
  ushort uVar1;
  ushort uVar2;
  mcmcx1def *ctx;
  mcmon n;
  mcmcxdef *pmVar3;
  mcsseg mVar4;
  uint uVar5;
  uchar *puVar6;
  ulong uVar7;
  mcmodef *pmVar8;
  int iVar9;
  undefined6 in_register_0000000a;
  uint uVar10;
  mcmon **ppmVar11;
  ulong uVar12;
  undefined6 in_register_00000032;
  uint uVar13;
  errcxdef *ctx_00;
  long lVar14;
  ushort n_00;
  long *plVar15;
  undefined4 uVar16;
  mcmon glb;
  mcmon local_76;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined4 local_68;
  int local_64;
  mcmcxdef *local_60;
  mcmon *local_58;
  mcmon *local_50;
  ulong local_48;
  mcscxdef *local_40;
  mcmon *local_38;
  
  local_48 = CONCAT62(in_register_0000000a,clinum);
  uVar12 = CONCAT62(in_register_00000032,siz) & 0xffffffff;
  ctx = cctx->mcmcxgl;
  local_64 = noclitrans;
  local_60 = cctx;
  local_58 = nump;
  puVar6 = mcmalo1(ctx,siz,&glb);
  if (puVar6 == (uchar *)0x0) {
    mcmgarb(ctx);
    local_50 = &ctx->mcmcxlru;
    local_40 = &ctx->mcmcxswc;
    local_38 = &ctx->mcmcxfre;
    local_74 = (uint)siz;
    local_70 = (uint)CONCAT62(in_register_00000032,siz);
    while (puVar6 = mcmalo1(ctx,(ushort)local_74,&glb), puVar6 == (uchar *)0x0) {
      uVar16 = 0;
      uVar10 = 1;
      while ((uVar10 < 3 && ((ushort)uVar16 < (ushort)uVar12))) {
        uVar1 = *local_50;
        local_6c = uVar10;
        local_68 = uVar16;
        while ((n_00 = uVar1, n_00 != 0xffff && ((ushort)uVar16 < (ushort)uVar12))) {
          pmVar8 = ctx->mcmcxtab[n_00 >> 8];
          uVar7 = (ulong)((n_00 & 0xff) << 5);
          uVar1 = *(ushort *)((long)&pmVar8->mcmonxt + uVar7);
          if (((*(byte *)((long)&pmVar8->mcmoflg + uVar7) & 100) == 0) &&
             ((plVar15 = (long *)((long)&pmVar8->mcmoptr + uVar7), uVar10 == 2 ||
              ((ushort)uVar12 <= *(ushort *)(plVar15 + 3))))) {
            pmVar8 = mcmoal(ctx,&local_76);
            n = local_76;
            if (local_76 == 0xffff) {
              uVar12 = (ulong)local_70;
              uVar10 = local_6c;
              uVar16 = local_68;
            }
            else {
              uVar2 = *(ushort *)((long)plVar15 + 0x14);
              if ((uVar2 & 3) != 0) {
                mVar4 = 0xffff;
                if ((uVar2 & 2) == 0) {
                  mVar4 = *(mcsseg *)(plVar15 + 1);
                }
                mVar4 = mcsout(local_40,(uint)n_00,(uchar *)*plVar15,*(ushort *)(plVar15 + 3),mVar4,
                               uVar2 & 1);
                *(mcsseg *)(plVar15 + 1) = mVar4;
              }
              pmVar8->mcmoptr = (uchar *)*plVar15;
              pmVar8->mcmosiz = *(ushort *)(plVar15 + 3);
              pmVar8->mcmoflg = 0x80;
              *(mcmon *)(*plVar15 + -8) = n;
              mcmlnkhd(ctx,local_38,n);
              *(byte *)((long)plVar15 + 0x14) = *(byte *)((long)plVar15 + 0x14) & 0xf7;
              mcmunl(ctx,n_00,local_50);
              local_68 = CONCAT22((short)((uint)local_68 >> 0x10),
                                  (short)local_68 + (short)plVar15[3]);
              uVar12 = (ulong)local_70;
              uVar10 = local_6c;
              uVar16 = local_68;
            }
          }
        }
        uVar10 = uVar10 + 1;
      }
      puVar6 = mcmalo1(ctx,(ushort)local_74,&glb);
      if ((ushort)uVar16 == 0) {
        if (puVar6 == (uchar *)0x0) {
          ctx_00 = ctx->mcmcxerr;
          iVar9 = 0xb;
          goto LAB_0012a2a0;
        }
        break;
      }
      if (puVar6 != (uchar *)0x0) break;
      mcmgarb(ctx);
    }
  }
  pmVar3 = local_60;
  if (local_64 == 0) {
    uVar12 = local_48;
    if ((short)local_48 == -1) {
      ppmVar11 = local_60->mcmcxmtb;
      uVar5 = 0xffffffff;
      iVar9 = 0;
      for (uVar13 = 0; uVar13 != local_60->mcmcxmsz; uVar13 = uVar13 + 1) {
        if (*ppmVar11 == (mcmon *)0x0) {
          if (uVar5 == 0xffffffff) {
            uVar5 = uVar13;
          }
        }
        else {
          for (lVar14 = 0; (short)lVar14 != 0x100; lVar14 = lVar14 + 1) {
            if ((*ppmVar11)[lVar14] == 0xffff) {
              uVar12 = (ulong)(uint)((int)lVar14 - iVar9);
              goto LAB_0012a21c;
            }
          }
        }
        ppmVar11 = ppmVar11 + 1;
        iVar9 = iVar9 + -0x100;
      }
      if (uVar5 == 0xffffffff) {
        ctx_00 = ctx->mcmcxerr;
        iVar9 = 10;
        goto LAB_0012a2a0;
      }
      uVar12 = (ulong)(uVar5 << 8);
    }
LAB_0012a21c:
    mcmcliexp(local_60,(mcmon)uVar12);
    if (pmVar3->mcmcxmtb[(uVar12 & 0xffff) >> 8][uVar12 & 0xff] != 0xffff) {
      ctx_00 = ctx->mcmcxerr;
      iVar9 = 9;
LAB_0012a2a0:
      errsigf(ctx_00,"TADS",iVar9);
    }
    pmVar3->mcmcxmtb[(uVar12 & 0xffff) >> 8][uVar12 & 0xff] = glb;
    glb = (mcmon)uVar12;
    if (local_58 == (mcmon *)0x0) {
      return puVar6;
    }
  }
  *local_58 = glb;
  return puVar6;
}

Assistant:

uchar *mcmalo0(mcmcxdef *cctx, ushort siz, mcmon *nump,
               mcmon clinum, int noclitrans)
{
    uchar     *ret;
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      glb;                       /* global object number allocated */
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    /* try once */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;

    /* collect some garbage */
    mcmgarb(ctx);
    
    /* try swapping until we get the memory or have nothing left to swap */
    for ( ;; )
    {
        /* try again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* nothing left to swap? */
        if (!mcmswap(ctx, siz))
            break;

        /* try yet again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* collect garbage once again */        
        mcmgarb(ctx);
    }
    
    /* try again */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;
    
    /* we have no other way of getting more memory, so signal an error */
    errsig(ctx->mcmcxerr, ERR_NOMEM1);
    NOTREACHEDV(uchar *);
    
done:
    if (noclitrans)
    {
        *nump = glb;
        return(ret);
    }
    
    /* we have an object - generate client number */
    if (clinum == MCMONINV)
    {
        /* find a free number */
        mcmon **p;
        uint    i;
        mcmon   j;
        mcmon  *q;
        int     found = FALSE;
        int     unused = -1;
        
        for (i = 0, p = cctx->mcmcxmtb ; i < cctx->mcmcxmsz ; ++i, ++p)
        {
            if (*p)
            {
                for (j = 0, q = *p ; j < 256 ; ++j, ++q)
                {
                    if (*q == MCMONINV)
                    {
                        found = TRUE;
                        break;
                    }
                }
            }
            else if (unused == -1)
                unused = i;            /* note an unused page mapping table */

            if (found) break;
        }
        
        if (found)
            clinum = (i << 8) + j;
        else if (unused != -1)
            clinum = (unused << 8);
        else
            errsig(ctx->mcmcxerr, ERR_CLIFULL);
    }

    /* expand client mapping table if necessary */
    mcmcliexp(cctx, clinum);

    /* make sure the entry isn't already in use */
    if (mcmc2g(cctx, clinum) != MCMONINV)
        errsig(ctx->mcmcxerr, ERR_CLIUSE);

    cctx->mcmcxmtb[clinum >> 8][clinum & 255] = glb;
    if (nump) *nump = clinum;
    return(ret);
}